

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockController::GetTransactionLock
          (CSharedMemoryFileLockController *this,CPalThread *pThread,
          FileTransactionLockType eLockType,DWORD dwOffsetLow,DWORD dwOffsetHigh,
          DWORD nNumberOfBytesToLockLow,DWORD nNumberOfBytesToLockHigh,
          IFileTransactionLock **ppTransactionLock)

{
  _func_int **pp_Var1;
  PAL_ERROR PVar2;
  IFileTransactionLock *pIVar3;
  _func_int **lockRgnStart;
  _func_int **nbBytesToLock;
  
  lockRgnStart = (_func_int **)CONCAT44(dwOffsetHigh,dwOffsetLow);
  nbBytesToLock = (_func_int **)CONCAT44(nNumberOfBytesToLockHigh,nNumberOfBytesToLockLow);
  PVar2 = FILELockFileRegion(this->m_shmFileLocks,this,(UINT64)lockRgnStart,(UINT64)nbBytesToLock,
                             RDWR_LOCK_RGN);
  if (PVar2 == 0) {
    pp_Var1 = (_func_int **)this->m_shmFileLocks;
    pIVar3 = (IFileTransactionLock *)InternalMalloc(0x28);
    if (pIVar3 == (IFileTransactionLock *)0x0) {
      *ppTransactionLock = (IFileTransactionLock *)0x0;
      FILEUnlockFileRegion
                (this->m_shmFileLocks,this,(UINT64)lockRgnStart,(UINT64)nbBytesToLock,RDWR_LOCK_RGN)
      ;
      PVar2 = 0xe;
    }
    else {
      pIVar3->_vptr_IFileTransactionLock = (_func_int **)&PTR_ReleaseLock_014c2950;
      pIVar3[1]._vptr_IFileTransactionLock = pp_Var1;
      pIVar3[2]._vptr_IFileTransactionLock = (_func_int **)this;
      pIVar3[3]._vptr_IFileTransactionLock = lockRgnStart;
      pIVar3[4]._vptr_IFileTransactionLock = nbBytesToLock;
      *ppTransactionLock = pIVar3;
      PVar2 = 0;
    }
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockController::GetTransactionLock(
    CPalThread *pThread,                // IN, OPTIONAL
    FileTransactionLockType eLockType,
    DWORD dwOffsetLow,
    DWORD dwOffsetHigh,
    DWORD nNumberOfBytesToLockLow,
    DWORD nNumberOfBytesToLockHigh,
    IFileTransactionLock **ppTransactionLock    // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    UINT64 lockRgnStart;
    UINT64 nbBytesToLock;

    lockRgnStart  = ((UINT64)dwOffsetHigh) << 32  | dwOffsetLow;
    nbBytesToLock = ((UINT64)nNumberOfBytesToLockHigh) << 32  | 
                             nNumberOfBytesToLockLow;

    palError = FILELockFileRegion(
        m_shmFileLocks,
        reinterpret_cast<PVOID>(this),
        lockRgnStart, 
        nbBytesToLock,
        RDWR_LOCK_RGN
        );

    if (NO_ERROR == palError)
    {
        *ppTransactionLock = InternalNew<CSharedMemoryFileTransactionLock>(m_shmFileLocks,
                                                                           reinterpret_cast<PVOID>(this),
                                                                           lockRgnStart, 
                                                                           nbBytesToLock);
        if (NULL == *ppTransactionLock)
        {
            palError = ERROR_OUTOFMEMORY;
            FILEUnlockFileRegion(
                m_shmFileLocks,
                reinterpret_cast<PVOID>(this),
                lockRgnStart, 
                nbBytesToLock,
                RDWR_LOCK_RGN
                );
        }
    }

    return palError;
}